

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_expr.hpp
# Opt level: O1

rt_expression_interface<double> * __thiscall
viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::substitute
          (rt_binary_expr<viennamath::rt_expression_interface<double>_> *this,
          vector<const_viennamath::rt_expression_interface<double>_*,_std::allocator<const_viennamath::rt_expression_interface<double>_*>_>
          *e,vector<const_viennamath::rt_expression_interface<double>_*,_std::allocator<const_viennamath::rt_expression_interface<double>_*>_>
             *repl)

{
  rt_expression_interface<double> *prVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  rt_expression_interface<double> *unaff_R12;
  bool bVar5;
  
  bVar5 = *(undefined8 **)(e + 8) != *(undefined8 **)e;
  if (bVar5) {
    iVar2 = (*(this->super_rt_expression_interface<double>)._vptr_rt_expression_interface[0xb])
                      (this,**(undefined8 **)e);
    if ((char)iVar2 == '\0') {
      prVar1 = (rt_expression_interface<double> *)0x1;
      do {
        unaff_R12 = prVar1;
        bVar5 = unaff_R12 < (rt_expression_interface<double> *)(*(long *)(e + 8) - *(long *)e >> 3);
        if (!bVar5) goto LAB_0010b212;
        iVar2 = (*(this->super_rt_expression_interface<double>)._vptr_rt_expression_interface[0xb])
                          (this,*(undefined8 *)(*(long *)e + (long)unaff_R12 * 8));
        prVar1 = (rt_expression_interface<double> *)
                 ((long)&unaff_R12->_vptr_rt_expression_interface + 1);
      } while ((char)iVar2 == '\0');
    }
    else {
      unaff_R12 = (rt_expression_interface<double> *)0x0;
    }
    unaff_R12 = (rt_expression_interface<double> *)
                (**(code **)(**(long **)(*(long *)repl + (long)unaff_R12 * 8) + 0x10))();
  }
LAB_0010b212:
  if (!bVar5) {
    unaff_R12 = (rt_expression_interface<double> *)operator_new(0x20);
    prVar1 = (this->lhs_)._M_ptr;
    iVar2 = (*prVar1->_vptr_rt_expression_interface[0xf])(prVar1,e,repl);
    iVar3 = (*((this->op_)._M_ptr)->_vptr_op_interface[2])();
    prVar1 = (this->rhs_)._M_ptr;
    iVar4 = (*prVar1->_vptr_rt_expression_interface[0xf])(prVar1,e,repl);
    unaff_R12->_vptr_rt_expression_interface = (_func_int **)&PTR__rt_binary_expr_00112840;
    unaff_R12[1]._vptr_rt_expression_interface = (_func_int **)CONCAT44(extraout_var,iVar2);
    unaff_R12[2]._vptr_rt_expression_interface = (_func_int **)CONCAT44(extraout_var_00,iVar3);
    unaff_R12[3]._vptr_rt_expression_interface = (_func_int **)CONCAT44(extraout_var_01,iVar4);
  }
  return unaff_R12;
}

Assistant:

InterfaceType * substitute(std::vector<const InterfaceType *> const &  e,
                                 std::vector<const InterfaceType *> const &  repl) const
      {
        for (size_t i=0; i<e.size(); ++i)
          if (deep_equal(e[i]))
            return repl[i]->clone();

        return new rt_binary_expr(lhs_->substitute(e, repl),
                               op_->clone(),
                               rhs_->substitute(e, repl) );
      }